

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O3

void testing::internal::InitGoogleMockImpl<wchar_t>(int *argc,wchar_t **argv)

{
  int iVar1;
  undefined1 str [8];
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  bool *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *streamable;
  internal *this;
  long lVar3;
  int iVar4;
  undefined1 local_58 [8];
  string arg_string;
  
  InitGoogleTest(argc,argv);
  if (1 < *argc) {
    arg_string.field_2._8_8_ = argv + 1;
    iVar4 = 1;
    streamable = extraout_RDX;
    do {
      this = (internal *)(argv + iVar4);
      StreamableToString<wchar_t*>((string *)local_58,this,(wchar_t **)streamable);
      str = local_58;
      bVar2 = ParseGoogleMockBoolFlag((char *)local_58,(char *)this,value);
      streamable = value_00;
      if (bVar2) {
LAB_00165b5e:
        iVar1 = *argc;
        if (iVar1 != iVar4) {
          streamable = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (arg_string.field_2._8_8_ + (long)iVar4 * 8);
          lVar3 = 0;
          do {
            *(pointer *)((long)streamable + lVar3 * 8 + -8) = (&streamable->_M_dataplus)[lVar3]._M_p
            ;
            lVar3 = lVar3 + 1;
          } while (iVar1 - iVar4 != (int)lVar3);
        }
        *argc = iVar1 + -1;
        iVar4 = iVar4 + -1;
      }
      else {
        bVar2 = ParseGoogleMockStringFlag<std::__cxx11::string>((char *)str,(char *)this,value_00);
        streamable = extraout_RDX_00;
        if (bVar2) goto LAB_00165b5e;
      }
      if (local_58 != (undefined1  [8])&arg_string._M_string_length) {
        operator_delete((void *)local_58,arg_string._M_string_length + 1);
        streamable = extraout_RDX_01;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != *argc);
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    if (ParseGoogleMockBoolFlag(arg, "catch_leaked_mocks",
                                &GMOCK_FLAG(catch_leaked_mocks)) ||
        ParseGoogleMockStringFlag(arg, "verbose", &GMOCK_FLAG(verbose))) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}